

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

bool CompileModuleFromSource(CompilerContext *ctx)

{
  ExpressionContext *ctx_00;
  CompilerStatistics *this;
  RegVmLoweredFunction *pRVar1;
  VmInstruction *pVVar2;
  SynBase *pSVar3;
  uint uVar4;
  int iVar5;
  ExprModule *pEVar6;
  VmModule *pVVar7;
  void *pvVar8;
  LlvmModule *pLVar9;
  RegVmLoweredModule *lowModule;
  char *pcVar10;
  bool bVar11;
  TraceScope traceScope_1;
  TraceScope traceScope;
  InstructionVMGraphContext instGraphCtx;
  TraceScope TStack_68;
  TraceScope local_58;
  undefined1 local_48 [16];
  char *local_38;
  char *pcStack_30;
  undefined8 uStack_28;
  undefined4 local_20;
  bool local_1c;
  undefined2 local_1b;
  bool local_19;
  
  if (CompileModuleFromSource(CompilerContext&)::token == '\0') {
    iVar5 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token);
    if (iVar5 != 0) {
      CompileModuleFromSource::token = NULLC::TraceGetToken("compiler","CompileModuleFromSource");
      __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_58,CompileModuleFromSource::token);
  pEVar6 = AnalyzeModuleFromSource(ctx);
  if (pEVar6 != (ExprModule *)0x0) {
    uVar4 = NULLCTime::clockMicro();
    ctx_00 = &ctx->exprCtx;
    (ctx->statistics).startTime = uVar4;
    (ctx->statistics).finishTime = 0;
    pVVar7 = CompileVm(ctx_00,&ctx->exprModule->super_ExprBase,ctx->code);
    ctx->vmModule = pVVar7;
    uVar4 = NULLCTime::clockMicro();
    this = &ctx->statistics;
    CompilerStatistics::Finish(this,"IrCodeGen",uVar4);
    if (ctx->vmModule == (VmModule *)0x0) {
      ctx->errorPos = (char *)0x0;
      if ((ctx->errorBuf != (char *)0x0) && ((ulong)ctx->errorBufSize != 0)) {
        bVar11 = false;
        NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                           "ERROR: internal compiler error: failed to create VmModule");
        goto LAB_002483ac;
      }
    }
    else {
      uVar4 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar4;
      (ctx->statistics).finishTime = 0;
      if (ctx->enableLogFiles == true) {
        if (CompileModuleFromSource(CompilerContext&)::token == '\0') {
          iVar5 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token);
          if (iVar5 != 0) {
            CompileModuleFromSource(CompilerContext&)::token =
                 NULLC::TraceGetToken("compiler","Debug::inst_graph");
            __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
          }
        }
        NULLC::TraceScope::TraceScope(&TStack_68,CompileModuleFromSource(CompilerContext&)::token);
        if ((ctx->outputCtx).stream != (void *)0x0) {
          __assert_fail("!ctx.outputCtx.stream",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                        ,0x266,"bool CompileModuleFromSource(CompilerContext &)");
        }
        pvVar8 = (*(ctx->outputCtx).openStream)("inst_graph.txt");
        (ctx->outputCtx).stream = pvVar8;
        if (pvVar8 != (void *)0x0) {
          local_48._8_8_ = &ctx->outputCtx;
          local_48._0_8_ = (char *)0x0;
          local_38 = (char *)((ulong)local_38 & 0xffffffff00000000);
          pcStack_30 = (char *)0x0;
          uStack_28._0_4_ = 0;
          uStack_28._4_4_ = 0;
          local_20._0_1_ = true;
          local_20._1_1_ = false;
          local_20._2_1_ = true;
          local_20._3_1_ = true;
          local_1c = true;
          local_19 = false;
          local_1b._0_1_ = true;
          local_1b._1_1_ = false;
          PrintGraph((InstructionVMGraphContext *)local_48,ctx->vmModule);
          (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
          (ctx->outputCtx).stream = (void *)0x0;
        }
        NULLC::TraceScope::~TraceScope(&TStack_68);
      }
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"Logging",uVar4);
      uVar4 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar4;
      (ctx->statistics).finishTime = 0;
      pLVar9 = CompileLlvm(ctx_00,ctx->exprModule);
      ctx->llvmModule = pLVar9;
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"LlvmCodeGen",uVar4);
      OptimizeModule(ctx);
      uVar4 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar4;
      (ctx->statistics).finishTime = 0;
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_UPDATE_LIVE_SETS);
      if (1 < ctx->optimizationLevel) {
        RunVmPass(ctx_00,ctx->vmModule,VM_PASS_PREPARE_SSA_EXIT);
      }
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_LEGALIZE_BITCASTS);
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_LEGALIZE_EXTRACTS);
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_CREATE_ALLOCA_STORAGE);
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"IrFinalization",uVar4);
      uVar4 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar4;
      (ctx->statistics).finishTime = 0;
      if (ctx->enableLogFiles == true) {
        if (CompileModuleFromSource(CompilerContext&)::token == '\0') {
          iVar5 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token);
          if (iVar5 != 0) {
            CompileModuleFromSource(CompilerContext&)::token =
                 NULLC::TraceGetToken("compiler","Debug::inst_graph_opt");
            __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
          }
        }
        NULLC::TraceScope::TraceScope(&TStack_68,CompileModuleFromSource(CompilerContext&)::token);
        if ((ctx->outputCtx).stream != (void *)0x0) {
          __assert_fail("!ctx.outputCtx.stream",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                        ,0x29c,"bool CompileModuleFromSource(CompilerContext &)");
        }
        pvVar8 = (*(ctx->outputCtx).openStream)("inst_graph_opt.txt");
        (ctx->outputCtx).stream = pvVar8;
        if (pvVar8 != (void *)0x0) {
          local_48._8_8_ = &ctx->outputCtx;
          local_48._0_8_ = (char *)0x0;
          local_38 = (char *)((ulong)local_38 & 0xffffffff00000000);
          pcStack_30 = (char *)0x0;
          uStack_28._0_4_ = 0;
          uStack_28._4_4_ = 0;
          local_20._0_1_ = true;
          local_20._1_1_ = false;
          local_20._2_1_ = true;
          local_20._3_1_ = true;
          local_1c = true;
          local_19 = false;
          local_1b._0_1_ = true;
          local_1b._1_1_ = false;
          PrintGraph((InstructionVMGraphContext *)local_48,ctx->vmModule);
          (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
          (ctx->outputCtx).stream = (void *)0x0;
        }
        NULLC::TraceScope::~TraceScope(&TStack_68);
      }
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"Logging",uVar4);
      uVar4 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar4;
      (ctx->statistics).finishTime = 0;
      lowModule = RegVmLowerModule(ctx_00,ctx->vmModule);
      ctx->regVmLoweredModule = lowModule;
      uVar4 = (lowModule->functions).count;
      if ((uVar4 == 0) ||
         (pRVar1 = (lowModule->functions).data[uVar4 - 1], pRVar1->hasRegisterOverflow != true)) {
        RegVmFinalizeModule(&ctx->instRegVmFinalizeCtx,lowModule);
        uVar4 = NULLCTime::clockMicro();
        CompilerStatistics::Finish(this,"IrLowering",uVar4);
        uVar4 = NULLCTime::clockMicro();
        (ctx->statistics).startTime = uVar4;
        (ctx->statistics).finishTime = 0;
        if (ctx->enableLogFiles == true) {
          if (CompileModuleFromSource(CompilerContext&)::token == '\0') {
            iVar5 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token);
            if (iVar5 != 0) {
              CompileModuleFromSource(CompilerContext&)::token =
                   NULLC::TraceGetToken("compiler","Debug::inst_graph_reg_low");
              __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
            }
          }
          NULLC::TraceScope::TraceScope(&TStack_68,CompileModuleFromSource(CompilerContext&)::token)
          ;
          if ((ctx->outputCtx).stream != (void *)0x0) {
            __assert_fail("!ctx.outputCtx.stream",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                          ,0x2d3,"bool CompileModuleFromSource(CompilerContext &)");
          }
          pvVar8 = (*(ctx->outputCtx).openStream)("inst_graph_reg_low.txt");
          (ctx->outputCtx).stream = pvVar8;
          if (pvVar8 != (void *)0x0) {
            local_48._8_8_ = &ctx->outputCtx;
            local_48._0_8_ = (char *)0x0;
            local_38 = (char *)0x0;
            pcStack_30 = (char *)0x0;
            uStack_28._1_7_ = SUB87(uStack_28,1) & 0xffffffffffff00;
            uStack_28._0_1_ = 1;
            PrintGraph((InstructionRegVmLowerGraphContext *)local_48,ctx->regVmLoweredModule);
            (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
            (ctx->outputCtx).stream = (void *)0x0;
          }
          NULLC::TraceScope::~TraceScope(&TStack_68);
        }
        uVar4 = NULLCTime::clockMicro();
        bVar11 = true;
        CompilerStatistics::Finish(this,"Logging",uVar4);
        goto LAB_002483ac;
      }
      pVVar2 = pRVar1->registerOverflowLocation;
      if ((pVVar2 == (VmInstruction *)0x0) ||
         (pSVar3 = (pVVar2->super_VmValue).source, pSVar3 == (SynBase *)0x0)) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = pSVar3->begin->pos;
      }
      ctx->errorPos = pcVar10;
      if ((ctx->errorBuf != (char *)0x0) && ((ulong)ctx->errorBufSize != 0)) {
        NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                           "ERROR: internal compiler error: register count overflow");
        if (ctx->errorPos != (char *)0x0) {
          pcVar10 = FindModuleCodeWithSourceLocation(ctx_00,ctx->errorPos);
          AddErrorLocationInfo(pcVar10,ctx->errorPos,ctx->errorBuf,ctx->errorBufSize);
        }
      }
    }
  }
  bVar11 = false;
LAB_002483ac:
  NULLC::TraceScope::~TraceScope(&local_58);
  return bVar11;
}

Assistant:

bool CompileModuleFromSource(CompilerContext &ctx)
{
	TRACE_SCOPE("compiler", "CompileModuleFromSource");

	if(!AnalyzeModuleFromSource(ctx))
		return false;

	ExpressionContext &exprCtx = ctx.exprCtx;

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.vmModule = CompileVm(exprCtx, ctx.exprModule, ctx.code);

	ctx.statistics.Finish("IrCodeGen", NULLCTime::clockMicro());

	if(!ctx.vmModule)
	{
		ctx.errorPos = NULL;

		if(ctx.errorBuf && ctx.errorBufSize)
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: internal compiler error: failed to create VmModule");

		return false;
	}

	//printf("# Instruction memory %dkb\n", pool.GetSize() / 1024);

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionVMGraphContext instGraphCtx(ctx.outputCtx);

			instGraphCtx.showUsers = true;
			instGraphCtx.displayAsTree = false;
			instGraphCtx.showFullTypes = false;
			instGraphCtx.showSource = true;

			PrintGraph(instGraphCtx, ctx.vmModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	// Build LLVM module is support is enabled or just to test execution paths in debug build
#if defined(NULLC_LLVM_SUPPORT)
	ctx.llvmModule = CompileLlvm(exprCtx, ctx.exprModule);
#elif !defined(NDEBUG)
	ctx.llvmModule = CompileLlvm(exprCtx, ctx.exprModule);
#endif

	ctx.statistics.Finish("LlvmCodeGen", NULLCTime::clockMicro());

	OptimizeModule(ctx);

	ctx.statistics.Start(NULLCTime::clockMicro());

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_UPDATE_LIVE_SETS);

	if(ctx.optimizationLevel >= 2)
		RunVmPass(exprCtx, ctx.vmModule, VM_PASS_PREPARE_SSA_EXIT);

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_LEGALIZE_BITCASTS);
	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_LEGALIZE_EXTRACTS);

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_CREATE_ALLOCA_STORAGE);

	ctx.statistics.Finish("IrFinalization", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph_opt");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph_opt.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionVMGraphContext instGraphCtx(ctx.outputCtx);

			instGraphCtx.showUsers = true;
			instGraphCtx.displayAsTree = false;
			instGraphCtx.showFullTypes = false;
			instGraphCtx.showSource = true;

			PrintGraph(instGraphCtx, ctx.vmModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.regVmLoweredModule = RegVmLowerModule(exprCtx, ctx.vmModule);

	if(!ctx.regVmLoweredModule->functions.empty() && ctx.regVmLoweredModule->functions.back()->hasRegisterOverflow)
	{
		RegVmLoweredFunction *function = ctx.regVmLoweredModule->functions.back();

		if(function->registerOverflowLocation && function->registerOverflowLocation->source)
			ctx.errorPos = function->registerOverflowLocation->source->begin->pos;
		else
			ctx.errorPos = NULL;

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: internal compiler error: register count overflow");

			if(ctx.errorPos)
				AddErrorLocationInfo(FindModuleCodeWithSourceLocation(ctx.exprCtx, ctx.errorPos), ctx.errorPos, ctx.errorBuf, ctx.errorBufSize);
		}

		return false;
	}

	RegVmFinalizeModule(ctx.instRegVmFinalizeCtx, ctx.regVmLoweredModule);

	ctx.statistics.Finish("IrLowering", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph_reg_low");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph_reg_low.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionRegVmLowerGraphContext instRegVmLowerGraphCtx(ctx.outputCtx);

			instRegVmLowerGraphCtx.showSource = true;

			PrintGraph(instRegVmLowerGraphCtx, ctx.regVmLoweredModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	return true;
}